

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

void greetable_skeleton_get_property(GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  GType GVar1;
  long lVar2;
  
  GVar1 = greetable_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  if (prop_id == 1) {
    g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
    g_value_copy(**(undefined8 **)(lVar2 + 0x20),value);
    g_mutex_unlock(*(long *)(lVar2 + 0x20) + 0x20);
    return;
  }
  g_assertion_message_expr
            (0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O2/basics_gen.c"
             ,0x509,"greetable_skeleton_get_property","prop_id != 0 && prop_id - 1 < 1");
}

Assistant:

static void
greetable_skeleton_get_property (GObject      *object,
  guint         prop_id,
  GValue       *value,
  GParamSpec   *pspec G_GNUC_UNUSED)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  g_assert (prop_id != 0 && prop_id - 1 < 1);
  g_mutex_lock (&skeleton->priv->lock);
  g_value_copy (&skeleton->priv->properties[prop_id - 1], value);
  g_mutex_unlock (&skeleton->priv->lock);
}